

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O0

shared_ptr<mnf::Manifold> __thiscall
mnf::SO3<mnf::ExpMapQuaternion>::getNewCopy_(SO3<mnf::ExpMapQuaternion> *this)

{
  SO3<mnf::ExpMapQuaternion> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SO3<mnf::ExpMapQuaternion> *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  undefined1 local_28 [8];
  shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>_> copySO3;
  SO3<mnf::ExpMapQuaternion> *this_local;
  
  this_00 = (SO3<mnf::ExpMapQuaternion> *)operator_new(0xa0);
  SO3(this_00,in_RSI);
  std::shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>>::shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>,void>
            ((shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>> *)local_28,this_00);
  std::shared_ptr<mnf::Manifold>::shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>,void>
            ((shared_ptr<mnf::Manifold> *)this,
             (shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>_> *)local_28);
  std::shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>_>::~shared_ptr
            ((shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>_> *)local_28);
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> SO3<Map>::getNewCopy_() const
{
  std::shared_ptr<SO3<Map> > copySO3(new SO3<Map>(*this));
  return copySO3;
}